

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

size_t psql::get_size_struct<0ul,psql::password_message>
                 (password_message *input,serialization_context *ctx)

{
  size_t sVar1;
  size_t sVar2;
  __tuple_element_t<0UL,_tuple<string_null_password_message::*>_> pmem;
  tuple<psql::string_null_psql::password_message::*> fields;
  serialization_context *ctx_local;
  password_message *input_local;
  
  fields.super__Tuple_impl<0UL,_psql::string_null_psql::password_message::*>.
  super__Head_base<0UL,_psql::string_null_psql::password_message::*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_psql::string_null_psql::password_message::*>)
       (_Tuple_impl<0UL,_psql::string_null_psql::password_message::*>)ctx;
  memset(&pmem,0,8);
  sVar1 = get_size_struct<1ul,psql::password_message>
                    (input,(serialization_context *)
                           fields.
                           super__Tuple_impl<0UL,_psql::string_null_psql::password_message::*>.
                           super__Head_base<0UL,_psql::string_null_psql::password_message::*,_false>
                           ._M_head_impl);
  sVar2 = get_size<psql::string_null>
                    (&input->password,
                     (serialization_context *)
                     fields.super__Tuple_impl<0UL,_psql::string_null_psql::password_message::*>.
                     super__Head_base<0UL,_psql::string_null_psql::password_message::*,_false>.
                     _M_head_impl);
  return sVar1 + sVar2;
}

Assistant:

std::size_t get_size_struct(
	[[maybe_unused]] const T& input,
	[[maybe_unused]] const serialization_context& ctx
) noexcept
{
	constexpr auto fields = get_struct_fields<T>::value;
	if constexpr (index == std::tuple_size<decltype(fields)>::value)
	{
		return 0;
	}
	else
	{
		constexpr auto pmem = std::get<index>(fields);
		return get_size_struct<index+1>(input, ctx) +
		       get_size(input.*pmem, ctx);
	}
}